

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

int SSL_set1_ech_config_list(SSL *ssl,uint8_t *ech_config_list,size_t ech_config_list_len)

{
  Span<const_unsigned_char> in;
  bool bVar1;
  pointer pSVar2;
  size_t extraout_RDX;
  Span<const_unsigned_char> ech_config_list_00;
  undefined1 local_38 [8];
  Span<const_unsigned_char> span;
  size_t ech_config_list_len_local;
  uint8_t *ech_config_list_local;
  SSL *ssl_local;
  
  span.size_ = ech_config_list_len;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    bssl::Span<const_unsigned_char>::Span
              ((Span<const_unsigned_char> *)local_38,ech_config_list,span.size_);
    ech_config_list_00.size_ = extraout_RDX;
    ech_config_list_00.data_ = span.data_;
    bVar1 = bssl::ssl_is_valid_ech_config_list((bssl *)local_38,ech_config_list_00);
    if (bVar1) {
      pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      in.size_ = (size_t)span.data_;
      in.data_ = (uchar *)local_38;
      bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar2->client_ech_config_list,in);
      ssl_local._4_4_ = (uint)bVar1;
    }
    else {
      ERR_put_error(0x10,0,0x13e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x39c);
      ssl_local._4_4_ = 0;
    }
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set1_ech_config_list(SSL *ssl, const uint8_t *ech_config_list,
                             size_t ech_config_list_len) {
  if (!ssl->config) {
    return 0;
  }

  auto span = Span(ech_config_list, ech_config_list_len);
  if (!ssl_is_valid_ech_config_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_ECH_CONFIG_LIST);
    return 0;
  }
  return ssl->config->client_ech_config_list.CopyFrom(span);
}